

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

SEQNUM __thiscall FIX::SessionState::getNextTargetMsgSeqNum(SessionState *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  Mutex::lock(&this->m_mutex);
  iVar1 = (*this->m_pStore->_vptr_MessageStore[5])();
  Mutex::unlock(&this->m_mutex);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

EXCEPT(IOException) {
    Locker l(m_mutex);
    return m_pStore->getNextTargetMsgSeqNum();
  }